

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_text_calculate_text_bounds
                  (nk_user_font *font,char *begin,int byte_len,float row_height,char **remaining,
                  nk_vec2 *out_offset,int *glyphs,int op)

{
  uint uVar1;
  long *in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  nk_vec2 *in_R8;
  int *in_R9;
  float in_XMM0_Da;
  nk_vec2 nVar2;
  int in_stack_00000008;
  int text_len;
  nk_rune unicode;
  int glyph_len;
  float glyph_width;
  float line_width;
  nk_vec2 text_size;
  float line_height;
  float local_68;
  uint in_stack_ffffffffffffff9c;
  nk_rune *in_stack_ffffffffffffffa0;
  int iVar3;
  int iVar4;
  int local_50;
  float local_4c;
  float local_48;
  nk_vec2 local_44;
  nk_vec2 local_8;
  
  local_44 = nk_vec2(0.0,0.0);
  local_48 = 0.0;
  iVar4 = 0;
  iVar3 = 0;
  if (((in_RSI == 0) || (in_EDX < 1)) || (in_RDI == (undefined8 *)0x0)) {
    local_8 = nk_vec2(0.0,in_XMM0_Da);
  }
  else {
    local_50 = nk_utf_decode((char *)0x0,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_8 = local_44;
    if (local_50 != 0) {
      local_4c = (float)(*(code *)in_RDI[2])(*(undefined4 *)(in_RDI + 1),*in_RDI,in_RSI,local_50);
      *in_R9 = 0;
      while( true ) {
        uVar1 = in_stack_ffffffffffffff9c & 0xffffff;
        if (iVar3 < in_EDX) {
          uVar1 = CONCAT13(local_50 != 0,(int3)in_stack_ffffffffffffff9c);
        }
        in_stack_ffffffffffffff9c = uVar1;
        if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') break;
        if (iVar4 == 10) {
          if (local_48 <= local_44.x) {
            local_68 = local_44.x;
          }
          else {
            local_68 = local_48;
          }
          local_44.y = in_XMM0_Da + local_44.y;
          local_44.x = local_68;
          local_48 = 0.0;
          *in_R9 = *in_R9 + 1;
          if (in_stack_00000008 == 1) break;
          iVar3 = iVar3 + 1;
          local_50 = nk_utf_decode((char *)CONCAT44(10,iVar3),in_stack_ffffffffffffffa0,
                                   in_stack_ffffffffffffff9c);
        }
        else if (iVar4 == 0xd) {
          iVar3 = iVar3 + 1;
          *in_R9 = *in_R9 + 1;
          local_50 = nk_utf_decode((char *)CONCAT44(0xd,iVar3),in_stack_ffffffffffffffa0,
                                   in_stack_ffffffffffffff9c);
        }
        else {
          *in_R9 = *in_R9 + 1;
          iVar3 = local_50 + iVar3;
          local_48 = local_4c + local_48;
          local_50 = nk_utf_decode((char *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffa0,
                                   in_stack_ffffffffffffff9c);
          local_4c = (float)(*(code *)in_RDI[2])
                                      (*(undefined4 *)(in_RDI + 1),*in_RDI,in_RSI + iVar3,local_50);
        }
      }
      if (local_44.x < local_48) {
        local_44.x = local_48;
      }
      if (in_R8 != (nk_vec2 *)0x0) {
        nVar2 = nk_vec2(local_48,local_44.y + in_XMM0_Da);
        *in_R8 = nVar2;
      }
      if ((0.0 < local_48) || ((local_44.y == 0.0 && (!NAN(local_44.y))))) {
        local_44.y = in_XMM0_Da + local_44.y;
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = in_RSI + iVar3;
      }
      local_8 = local_44;
    }
  }
  return local_8;
}

Assistant:

NK_LIB struct nk_vec2
nk_text_calculate_text_bounds(const struct nk_user_font *font,
const char *begin, int byte_len, float row_height, const char **remaining,
struct nk_vec2 *out_offset, int *glyphs, int op)
{
float line_height = row_height;
struct nk_vec2 text_size = nk_vec2(0,0);
float line_width = 0.0f;

float glyph_width;
int glyph_len = 0;
nk_rune unicode = 0;
int text_len = 0;
if (!begin || byte_len <= 0 || !font)
return nk_vec2(0,row_height);

glyph_len = nk_utf_decode(begin, &unicode, byte_len);
if (!glyph_len) return text_size;
glyph_width = font->width(font->userdata, font->height, begin, glyph_len);

*glyphs = 0;
while ((text_len < byte_len) && glyph_len) {
if (unicode == '\n') {
text_size.x = NK_MAX(text_size.x, line_width);
text_size.y += line_height;
line_width = 0;
*glyphs+=1;
if (op == NK_STOP_ON_NEW_LINE)
break;

text_len++;
glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
continue;
}

if (unicode == '\r') {
text_len++;
*glyphs+=1;
glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
continue;
}

*glyphs = *glyphs + 1;
text_len += glyph_len;
line_width += (float)glyph_width;
glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
glyph_width = font->width(font->userdata, font->height, begin+text_len, glyph_len);
continue;
}

if (text_size.x < line_width)
text_size.x = line_width;
if (out_offset)
*out_offset = nk_vec2(line_width, text_size.y + line_height);
if (line_width > 0 || text_size.y == 0.0f)
text_size.y += line_height;
if (remaining)
*remaining = begin+text_len;
return text_size;
}